

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void curve_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,t_float basey
              ,int vis)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  _glist *p_Var5;
  _glist *x;
  _glist *x_00;
  ulong uVar6;
  uint uVar7;
  t_pd f;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  t_float tVar12;
  t_float tVar13;
  float local_758;
  char *tags [3];
  char tag [80];
  char tag0 [80];
  t_word pix [200];
  
  uVar7 = *(uint *)&z[0xd].g_next;
  tags[0] = tag;
  tags[1] = tag0;
  tags[2] = "curve";
  if (vis == 0) {
    sprintf(tag0,"curve%lx",z);
    iVar2 = sprintf(tag,"curve%lx_data%lx",z,data);
    if (1 < (int)uVar7) {
      p_Var5 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar2));
      pdgui_vmess((char *)0x0,"crs",p_Var5,"delete",tag);
    }
  }
  else {
    fVar11 = 0.0;
    if (*(char *)&z[0xb].g_pd == '\x01') {
      if (*(char *)((long)&z[0xb].g_pd + 1) == '\0') {
        fVar11 = *(float *)&z[0xb].g_next;
      }
      else {
        fVar11 = template_getfloat(template,(t_symbol *)z[0xb].g_next,data,0);
      }
    }
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      sprintf(tag0,"curve%lx",z);
      sprintf(tag,"curve%lx_data%lx",z,data);
      if ((int)uVar7 < 2) {
        post("warning: drawing shapes need at least two points to be graphed");
      }
      else {
        uVar1 = *(uint *)&z[3].g_pd;
        tVar12 = fielddesc_getfloat((_fielddesc *)&z[8].g_next,template,data,1);
        uVar9 = 100;
        if ((int)uVar7 < 100) {
          uVar9 = (ulong)uVar7;
        }
        f = z[0xe].g_pd;
        lVar10 = 0;
        do {
          tVar13 = fielddesc_getcoord((_fielddesc *)f,template,data,1);
          tVar13 = glist_xtopixels(glist,tVar13 + basex);
          *(t_float *)((long)pix + lVar10) = tVar13;
          tVar13 = fielddesc_getcoord((_fielddesc *)&f->c_nmethod,template,data,1);
          tVar13 = glist_ytopixels(glist,tVar13 + basey);
          *(t_float *)((long)pix + lVar10 + 8) = tVar13;
          lVar10 = lVar10 + 0x10;
          f = (t_pd)&f->c_symbolmethod;
        } while (uVar9 * 0x10 != lVar10);
        local_758 = 1.0;
        if (1.0 <= tVar12) {
          local_758 = tVar12;
        }
        if ((glist->field_0xe9 & 1) != 0) {
          iVar2 = glist_getzoom(glist);
          local_758 = local_758 * (float)iVar2;
        }
        tVar12 = fielddesc_getfloat((_fielddesc *)(z + 6),template,data,1);
        uVar7 = (int)tVar12;
        if ((int)tVar12 < 1) {
          uVar7 = 0;
        }
        uVar6 = (ulong)uVar7 * 0x66666667;
        uVar4 = (uint)(uVar6 >> 0x20);
        uVar3 = (uint)((ulong)uVar7 * 0x51eb851f >> 0x20) & 0x3fffffe0;
        if (0xfe < uVar3) {
          uVar3 = 0xff;
        }
        iVar2 = ((uVar4 >> 2) + (int)(uVar6 / 0x2800000000) * -10) * 0x20;
        if (0xfe < iVar2) {
          iVar2 = 0xff;
        }
        uVar7 = (uVar7 + ((uVar4 >> 2) + (uVar4 >> 2)) * -5) * 0x20;
        if (0xfe < (int)uVar7) {
          uVar7 = 0xff;
        }
        uVar6 = (ulong)(uVar7 | uVar3 << 0x10 | iVar2 << 8);
        p_Var5 = glist_getcanvas((_glist *)(ulong)(uVar3 << 0x10));
        pcVar8 = "polygon";
        if ((uVar1 & 1) == 0) {
          pcVar8 = "line";
        }
        pdgui_vmess((char *)0x0,"crr iiii rf ri rS",(double)local_758,p_Var5,"create",pcVar8,0,0,0,0
                    ,"-width","-smooth",(ulong)(uVar1 >> 1 & 1),"-tags",3,tags);
        p_Var5 = glist_getcanvas(x);
        pdgui_vmess((char *)0x0,"crs w",p_Var5,"coords",tag,(ulong)(uint)((int)uVar9 * 2),pix);
        if ((uVar1 & 1) == 0) {
          p_Var5 = glist_getcanvas(x_00);
          pdgui_vmess((char *)0x0,"crs rk",p_Var5,"itemconfigure",tag,"-fill",uVar6);
        }
        else {
          tVar12 = fielddesc_getfloat((_fielddesc *)&z[3].g_next,template,data,1);
          uVar7 = (int)tVar12;
          if ((int)tVar12 < 1) {
            uVar7 = 0;
          }
          uVar9 = (ulong)uVar7 * 0x66666667;
          uVar1 = (uint)(uVar9 >> 0x20);
          uVar3 = uVar1 >> 2;
          uVar4 = (uint)((ulong)uVar7 * 0x51eb851f >> 0x20) & 0x3fffffe0;
          if (0xfe < uVar4) {
            uVar4 = 0xff;
          }
          iVar2 = (uVar3 + (int)(uVar9 / 0x2800000000) * -10) * 0x20;
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          uVar7 = (uVar7 + (uVar3 + (uVar1 >> 2)) * -5) * 0x20;
          if (0xfe < (int)uVar7) {
            uVar7 = 0xff;
          }
          p_Var5 = glist_getcanvas((_glist *)(ulong)(uVar4 << 0x10));
          pdgui_vmess((char *)0x0,"crs rk rk",p_Var5,"itemconfigure",tag,"-fill",
                      (ulong)(uVar7 | uVar4 << 0x10 | iVar2 << 8),"-outline",uVar6);
        }
      }
    }
  }
  return;
}

Assistant:

static void curve_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int vis)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    t_fielddesc *f = x->x_vec;
    char tag0[80], tag[80];
    const char*tags[] = {tag, tag0, "curve"};
        /* see comment in plot_vis() */
    if (vis && !fielddesc_getfloat(&x->x_vis, template, data, 0))
        return;
    sprintf(tag0, "curve%lx", x);
    sprintf(tag , "curve%lx_data%lx", x, data);
    if (vis)
    {
        if (n > 1)
        {
            int flags = x->x_flags, closed = (flags & CLOSED);
            t_float width = fielddesc_getfloat(&x->x_width, template, data, 1);
            int outline;
            t_word pix[200];

            if (n > 100)
                n = 100;
                /* calculate the pixel values before we start printing
                out the TK message so that "error" printout won't be
                interspersed with it.  Only show up to 100 points so we don't
                have to allocate memory here. */
            for (i = 0, f = x->x_vec; i < n; i++, f += 2)
            {
                pix[2*i].w_float = glist_xtopixels(glist,
                    basex + fielddesc_getcoord(f, template, data, 1));
                pix[2*i+1].w_float = glist_ytopixels(glist,
                    basey + fielddesc_getcoord(f+1, template, data, 1));
            }
            if (width < 1) width = 1;
            if (glist->gl_isgraph)
                width *= glist_getzoom(glist);
            outline = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));

            pdgui_vmess(0, "crr iiii rf ri rS",
                glist_getcanvas(glist), "create",
                (flags & CLOSED)?"polygon":"line",
                0, 0, 0, 0,
                "-width", width,
                "-smooth", !!(flags & BEZ),
                "-tags", 3, tags);

            pdgui_vmess(0, "crs w",
                glist_getcanvas(glist), "coords", tag,
                2*n, pix);

            if (flags & CLOSED)
            {
                int fill = numbertocolor(
                    fielddesc_getfloat(&x->x_fillcolor, template, data, 1));
                pdgui_vmess(0, "crs rk rk",
                    glist_getcanvas(glist), "itemconfigure", tag,
                    "-fill", fill,
                    "-outline", outline);
            } else
                pdgui_vmess(0, "crs rk",
                    glist_getcanvas(glist), "itemconfigure", tag,
                    "-fill", outline);
        }
        else post("warning: drawing shapes need at least two points to be graphed");
    }
    else
    {
        if (n > 1)
            pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
    }
}